

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O0

bool readBool(FILE *stream,uint8_t *value)

{
  int iVar1;
  size_t sVar2;
  undefined1 *in_RSI;
  FILE *in_RDI;
  uint8_t v;
  fpos_t pos;
  undefined1 local_29;
  fpos_t local_28;
  undefined1 *local_18;
  FILE *local_10;
  bool local_1;
  
  *in_RSI = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = fgetpos(in_RDI,&local_28);
  if (iVar1 == 0) {
    sVar2 = fread(&local_29,1,1,local_10);
    if (sVar2 == 1) {
      *local_18 = local_29;
      local_1 = true;
    }
    else {
      fsetpos(local_10,&local_28);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool readBool(FILE* stream, uint8_t& value)
{
	value = 0;
	fpos_t pos;
	if (fgetpos(stream, &pos) != 0)
	{
		return false;
	}
	uint8_t v;
	if (fread(&v, 1, 1, stream) != 1)
	{
		(void) fsetpos(stream, &pos);
		return false;
	}
	value = v;
	return true;
}